

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

void __thiscall ON_Displacement::ON_Displacement(ON_Displacement *this,ON_XMLNode *dsp_node)

{
  ON_SimpleArray<ON_Displacement::SubItem_*> *this_00;
  bool bVar1;
  int iVar2;
  CImpl *pCVar3;
  CImplDSP *pCVar4;
  undefined4 extraout_var;
  wchar_t *name;
  ON_XMLNode *pOVar5;
  undefined4 extraout_var_00;
  SubItem *this_01;
  ON_XMLNode *this_02;
  ChildIterator it;
  ON_XMLNode new_dsp_node;
  SubItem *local_130;
  ChildIterator local_128;
  ON_XMLNode local_118;
  
  (this->super_ON_MeshModifier)._vptr_ON_MeshModifier = (_func_int **)&PTR__ON_MeshModifier_00814370
  ;
  pCVar3 = (CImpl *)operator_new(0x40);
  *(undefined8 *)
   ((long)&(pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (pCVar3->super_ON_InternalXMLImpl)._local_node = (ON_XMLNode *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._model_node = (ON_XMLNode *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._vptr_ON_InternalXMLImpl =
       (_func_int **)&PTR__ON_InternalXMLImpl_00814c98;
  (this->super_ON_MeshModifier).m_impl = pCVar3;
  (this->super_ON_MeshModifier)._vptr_ON_MeshModifier = (_func_int **)&PTR__ON_Displacement_00814508
  ;
  pCVar4 = (CImplDSP *)operator_new(0x18);
  (pCVar4->m_subs)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00814cd8;
  (pCVar4->m_subs).m_a = (SubItem **)0x0;
  (pCVar4->m_subs).m_count = 0;
  (pCVar4->m_subs).m_capacity = 0;
  this->m_impl_dsp = pCVar4;
  iVar2 = (*dsp_node->_vptr_ON_XMLNode[3])(dsp_node);
  name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar2));
  ON_XMLNode::ON_XMLNode(&local_118,name);
  (*dsp_node->_vptr_ON_XMLNode[0x2c])(&local_128,dsp_node);
  while( true ) {
    pOVar5 = ON_XMLNode::ChildIterator::GetNextChild(&local_128);
    if (pOVar5 == (ON_XMLNode *)0x0) break;
    iVar2 = (*pOVar5->_vptr_ON_XMLNode[3])(pOVar5);
    bVar1 = ::operator==(L"sub",(ON_wString *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      this_00 = &this->m_impl_dsp->m_subs;
      this_01 = (SubItem *)operator_new(8);
      SubItem::SubItem(this_01,pOVar5);
      local_130 = this_01;
      ON_SimpleArray<ON_Displacement::SubItem_*>::Append(this_00,&local_130);
    }
    else {
      this_02 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(this_02,pOVar5);
      ON_XMLNode::AttachChildNode(&local_118,this_02);
    }
  }
  pOVar5 = ON_InternalXMLImpl::Node
                     (&((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl);
  ON_XMLNode::operator=(pOVar5,&local_118);
  ON_XMLNode::ChildIterator::~ChildIterator(&local_128);
  ON_XMLRootNode::~ON_XMLRootNode((ON_XMLRootNode *)&local_118);
  return;
}

Assistant:

ON_Displacement::ON_Displacement(const ON_XMLNode& dsp_node)
{
  m_impl_dsp = new CImplDSP;

  // Iterate over the displacement node looking at each child node's name. If the child
  // node is a sub-item node, create a sub-item object to hold the sub-item XML. Otherwise add
  // a copy of the child node to a new displacement node.
  ON_XMLNode new_dsp_node(dsp_node.TagName());

  auto it = dsp_node.GetChildIterator();
  while (ON_XMLNode* child_node = it.GetNextChild())
  {
    if (ON_DISPLACEMENT_SUB == child_node->TagName())
    {
      m_impl_dsp->m_subs.Append(new SubItem(*child_node));
    }
    else
    {
      new_dsp_node.AttachChildNode(new ON_XMLNode(*child_node));
    }
  }

  // Copy the new displacement node to our node. It only contains displacement XML with no sub-item nodes.
  m_impl->Node() = new_dsp_node;
}